

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void ncc_compute(int n,double *x,double *w)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  
  if (n == 1) {
    *x = 0.0;
    *w = 2.0;
    return;
  }
  if (0 < n) {
    iVar1 = n + -1;
    dVar3 = (double)iVar1;
    uVar2 = 0;
    do {
      x[uVar2] = ((double)(int)uVar2 - (double)iVar1) / dVar3;
      uVar2 = uVar2 + 1;
      iVar1 = iVar1 + -1;
    } while ((uint)n != uVar2);
  }
  nc_compute_weights(n,-1.0,1.0,x,w);
  return;
}

Assistant:

void ncc_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    NCC_COMPUTE computes a Newton-Cotes closed quadrature rule.
//
//  Discussion:
//
//    For the interval [-1.0,+1.0], the Newton-Cotes closed quadrature rule
//    estimates
//
//      Integral ( -1 <= X <= +1 ) F(X) dX
//
//    using N abscissas X and weights W:
//
//      sum ( 1 <= I <= N ) W[I] * F ( X[I] ).
//
//    For the CLOSED rule, the abscissas are equally spaced and include 
//    the end points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 November 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  double x_max = 1.0;
  double x_min = -1.0;

  if ( n == 1 )
  {
    x[0] = ( x_max + x_min ) / 2.0;
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      x[i] = ( double( n - i - 1 ) * x_min   
             + double(     i     ) * x_max ) 
             / double( n     - 1 );
    }
  }

  if ( n == 1 )
  {
    w[0] = x_max - x_min;
  }
  else
  {
    nc_compute_weights ( n, x_min, x_max, x, w );
  }

  return;
}